

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSourceGroup.cxx
# Opt level: O3

cmSourceGroup * __thiscall cmSourceGroup::LookupChild(cmSourceGroup *this,string *name)

{
  cmSourceGroup *pcVar1;
  pointer __s2;
  size_t __n;
  int iVar2;
  cmSourceGroup *group;
  cmSourceGroup *pcVar3;
  
  pcVar3 = (this->Internal->GroupChildren).
           super__Vector_base<cmSourceGroup,_std::allocator<cmSourceGroup>_>._M_impl.
           super__Vector_impl_data._M_start;
  pcVar1 = (this->Internal->GroupChildren).
           super__Vector_base<cmSourceGroup,_std::allocator<cmSourceGroup>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pcVar3 != pcVar1) {
    __s2 = (name->_M_dataplus)._M_p;
    __n = name->_M_string_length;
    do {
      if ((pcVar3->Name)._M_string_length == __n) {
        if (__n == 0) {
          return pcVar3;
        }
        iVar2 = bcmp((pcVar3->Name)._M_dataplus._M_p,__s2,__n);
        if (iVar2 == 0) {
          return pcVar3;
        }
      }
      pcVar3 = pcVar3 + 1;
    } while (pcVar3 != pcVar1);
  }
  return (cmSourceGroup *)0x0;
}

Assistant:

cmSourceGroup* cmSourceGroup::LookupChild(const std::string& name)
{
  for (cmSourceGroup& group : this->Internal->GroupChildren) {
    // look if descenened is the one were looking for
    if (group.GetName() == name) {
      return (&group); // if it so return it
    }
  }

  // if no child with this name was found return NULL
  return nullptr;
}